

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_timer_schedule(void)

{
  int iVar1;
  fio_ls_embd_s *arg1;
  bool bVar2;
  timespec b;
  fio_ls_embd_s *tmp;
  timespec now;
  
  b = fio_last_tick();
  fio_lock(&fio_timer_lock);
  while( true ) {
    iVar1 = fio_ls_embd_any(&fio_timers);
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = fio_timer_compare((timespec)fio_timers.next[1],b);
      bVar2 = -1 < iVar1;
    }
    if (!bVar2) break;
    arg1 = fio_ls_embd_remove(fio_timers.next);
    fio_defer(fio_timer_perform_single,arg1,(void *)0x0);
  }
  fio_unlock(&fio_timer_lock);
  return;
}

Assistant:

static void fio_timer_schedule(void) {
  struct timespec now = fio_last_tick();
  fio_lock(&fio_timer_lock);
  while (fio_ls_embd_any(&fio_timers) &&
         fio_timer_compare(
             FIO_LS_EMBD_OBJ(fio_timer_s, node, fio_timers.next)->due, now) >=
             0) {
    fio_ls_embd_s *tmp = fio_ls_embd_remove(fio_timers.next);
    fio_defer(fio_timer_perform_single, FIO_LS_EMBD_OBJ(fio_timer_s, node, tmp),
              NULL);
  }
  fio_unlock(&fio_timer_lock);
}